

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O3

void __thiscall llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  void **__dest;
  void **__src;
  size_t __n;
  void **ppvVar5;
  void **ppvVar6;
  ulong uVar7;
  long lVar8;
  
  if (this == RHS) {
    return;
  }
  ppvVar6 = this->SmallArray;
  ppvVar5 = this->CurArray;
  __dest = RHS->SmallArray;
  __src = RHS->CurArray;
  if (ppvVar5 != ppvVar6) {
    if (__src == __dest) {
      if ((ulong)RHS->NumNonEmpty != 0) {
        memmove(ppvVar6,__src,(ulong)RHS->NumNonEmpty << 3);
        ppvVar6 = this->SmallArray;
        ppvVar5 = this->CurArray;
      }
      uVar1 = RHS->CurArraySize;
      RHS->CurArraySize = this->CurArraySize;
      this->CurArraySize = uVar1;
      uVar1 = this->NumNonEmpty;
      this->NumNonEmpty = RHS->NumNonEmpty;
      RHS->NumNonEmpty = uVar1;
      uVar1 = this->NumTombstones;
      this->NumTombstones = RHS->NumTombstones;
      RHS->NumTombstones = uVar1;
      RHS->CurArray = ppvVar5;
      this->CurArray = ppvVar6;
      return;
    }
    this->CurArray = __src;
    RHS->CurArray = ppvVar5;
    uVar1 = this->CurArraySize;
    this->CurArraySize = RHS->CurArraySize;
    RHS->CurArraySize = uVar1;
    goto LAB_00182f42;
  }
  if (__src != __dest) {
    if ((ulong)this->NumNonEmpty != 0) {
      memmove(__dest,ppvVar5,(ulong)this->NumNonEmpty << 3);
      __dest = RHS->SmallArray;
      __src = RHS->CurArray;
    }
    uVar1 = RHS->CurArraySize;
    RHS->CurArraySize = this->CurArraySize;
    this->CurArraySize = uVar1;
    uVar1 = RHS->NumNonEmpty;
    RHS->NumNonEmpty = this->NumNonEmpty;
    this->NumNonEmpty = uVar1;
    uVar1 = RHS->NumTombstones;
    RHS->NumTombstones = this->NumTombstones;
    this->NumTombstones = uVar1;
    this->CurArray = __src;
    RHS->CurArray = __dest;
    return;
  }
  uVar1 = RHS->NumNonEmpty;
  uVar2 = this->NumNonEmpty;
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  uVar7 = (ulong)uVar4;
  if (uVar4 != 0) {
    lVar8 = 0;
    do {
      uVar3 = *(undefined8 *)((long)ppvVar6 + lVar8);
      *(undefined8 *)((long)ppvVar6 + lVar8) = *(undefined8 *)((long)__dest + lVar8);
      *(undefined8 *)((long)__dest + lVar8) = uVar3;
      lVar8 = lVar8 + 8;
    } while (uVar7 * 8 - lVar8 != 0);
  }
  if (uVar1 < uVar2) {
    ppvVar6 = this->SmallArray;
    __n = (uVar2 - uVar7) * 8;
    ppvVar5 = RHS->SmallArray;
LAB_00182f34:
    memmove(ppvVar5 + uVar7,ppvVar6 + uVar7,__n);
  }
  else {
    __n = (ulong)uVar1 * 8 + uVar7 * -8;
    if (__n != 0) {
      ppvVar6 = RHS->SmallArray;
      ppvVar5 = this->SmallArray;
      goto LAB_00182f34;
    }
  }
  if (this->CurArraySize != RHS->CurArraySize) {
    __assert_fail("this->CurArraySize == RHS.CurArraySize",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x10c,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
  }
LAB_00182f42:
  uVar1 = this->NumNonEmpty;
  this->NumNonEmpty = RHS->NumNonEmpty;
  RHS->NumNonEmpty = uVar1;
  uVar1 = this->NumTombstones;
  this->NumTombstones = RHS->NumTombstones;
  RHS->NumTombstones = uVar1;
  return;
}

Assistant:

void SmallPtrSetImplBase::swap(SmallPtrSetImplBase &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither set is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->CurArray, RHS.CurArray);
    std::swap(this->CurArraySize, RHS.CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    return;
  }

  // FIXME: From here on we assume that both sets have the same small size.

  // If only RHS is small, copy the small elements into LHS and move the pointer
  // from LHS to RHS.
  if (!this->isSmall() && RHS.isSmall()) {
    assert(RHS.CurArray == RHS.SmallArray);
    std::copy(RHS.CurArray, RHS.CurArray + RHS.NumNonEmpty, this->SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    RHS.CurArray = this->CurArray;
    this->CurArray = this->SmallArray;
    return;
  }

  // If only LHS is small, copy the small elements into RHS and move the pointer
  // from RHS to LHS.
  if (this->isSmall() && !RHS.isSmall()) {
    assert(this->CurArray == this->SmallArray);
    std::copy(this->CurArray, this->CurArray + this->NumNonEmpty,
              RHS.SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(RHS.NumNonEmpty, this->NumNonEmpty);
    std::swap(RHS.NumTombstones, this->NumTombstones);
    this->CurArray = RHS.CurArray;
    RHS.CurArray = RHS.SmallArray;
    return;
  }

  // Both a small, just swap the small elements.
  assert(this->isSmall() && RHS.isSmall());
  unsigned MinNonEmpty = std::min(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap_ranges(this->SmallArray, this->SmallArray + MinNonEmpty,
                   RHS.SmallArray);
  if (this->NumNonEmpty > MinNonEmpty) {
    std::copy(this->SmallArray + MinNonEmpty,
              this->SmallArray + this->NumNonEmpty,
              RHS.SmallArray + MinNonEmpty);
  } else {
    std::copy(RHS.SmallArray + MinNonEmpty, RHS.SmallArray + RHS.NumNonEmpty,
              this->SmallArray + MinNonEmpty);
  }
  assert(this->CurArraySize == RHS.CurArraySize);
  std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap(this->NumTombstones, RHS.NumTombstones);
}